

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

void __thiscall
cmArchiveWrite::cmArchiveWrite
          (cmArchiveWrite *this,ostream *os,Compress c,string *format,int compressionLevel,
          int numThreads)

{
  int iVar1;
  archive *paVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  char *v;
  int local_9c4;
  string local_990;
  cmAlphaNum local_970;
  cmAlphaNum local_940;
  string local_910;
  string local_8f0;
  cmAlphaNum local_8d0;
  cmAlphaNum local_8a0;
  string local_870;
  string local_850;
  cmAlphaNum local_830;
  cmAlphaNum local_800;
  string local_7d0;
  string local_7b0;
  cmAlphaNum local_790;
  cmAlphaNum local_760;
  string local_730;
  string local_710 [8];
  string archiveFilterName;
  string compressionLevelStr;
  cmAlphaNum local_6b0;
  cmAlphaNum local_680;
  string local_650;
  string local_630;
  cmAlphaNum local_610;
  cmAlphaNum local_5e0;
  string local_5b0;
  string local_590;
  cmAlphaNum local_570;
  cmAlphaNum local_540;
  string local_510;
  string local_4f0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  string local_470;
  string local_450;
  cmAlphaNum local_430;
  cmAlphaNum local_400;
  string local_3d0;
  string local_3b0;
  cmAlphaNum local_390;
  cmAlphaNum local_360;
  string local_330;
  string local_310;
  cmAlphaNum local_2f0;
  cmAlphaNum local_2c0;
  string local_290;
  undefined1 local_270 [8];
  string source_date_epoch;
  cmAlphaNum local_230;
  cmAlphaNum local_200;
  string local_1d0;
  string local_1b0;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  string local_130;
  int local_10c;
  string local_108;
  cmAlphaNum local_e8;
  cmAlphaNum local_b8;
  string local_88;
  undefined1 local_68 [8];
  string sNumThreads;
  int local_40 [2];
  int upperLimit;
  int local_30;
  int local_2c;
  int numThreads_local;
  int compressionLevel_local;
  string *format_local;
  ostream *poStack_18;
  Compress c_local;
  ostream *os_local;
  cmArchiveWrite *this_local;
  
  this->Stream = os;
  local_30 = numThreads;
  local_2c = compressionLevel;
  _numThreads_local = format;
  format_local._4_4_ = c;
  poStack_18 = os;
  os_local = (ostream *)this;
  paVar2 = archive_write_new();
  this->Archive = paVar2;
  paVar2 = archive_read_disk_new();
  this->Disk = paVar2;
  this->Verbose = false;
  std::__cxx11::string::string((string *)&this->Format,(string *)_numThreads_local);
  std::__cxx11::string::string((string *)&this->Error);
  std::__cxx11::string::string((string *)&this->MTime);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Uid);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Gid);
  std::__cxx11::string::string((string *)&this->Uname);
  std::__cxx11::string::string((string *)&this->Gname);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Permissions);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->PermissionsMask);
  if (local_30 < 1) {
    if (local_30 == 0) {
      local_9c4 = std::numeric_limits<int>::max();
    }
    else {
      local_9c4 = local_30;
      if (local_30 < 1) {
        local_9c4 = -local_30;
      }
    }
    local_40[0] = local_9c4;
    sNumThreads.field_2._12_4_ = std::thread::hardware_concurrency();
    sNumThreads.field_2._8_4_ = 1;
    piVar3 = std::clamp<int>((int *)(sNumThreads.field_2._M_local_buf + 0xc),
                             (int *)(sNumThreads.field_2._M_local_buf + 8),local_40);
    local_30 = *piVar3;
  }
  std::__cxx11::to_string((string *)local_68,local_30);
  switch(format_local._4_4_) {
  case CompressNone:
    iVar1 = archive_write_add_filter_none(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_b8,"archive_write_add_filter_none: ");
      cm_archive_error_string_abi_cxx11_(&local_108,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_e8,&local_108);
      cmStrCat<>(&local_88,&local_b8,&local_e8);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    break;
  case CompressCompress:
    iVar1 = archive_write_add_filter_compress(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_160,"archive_write_add_filter_compress: ");
      cm_archive_error_string_abi_cxx11_(&local_1b0,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_190,&local_1b0);
      cmStrCat<>(&local_130,&local_160,&local_190);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1b0);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    break;
  case CompressGZip:
    iVar1 = archive_write_add_filter_gzip(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_200,"archive_write_add_filter_gzip: ");
      cm_archive_error_string_abi_cxx11_
                ((string *)((long)&source_date_epoch.field_2 + 8),this->Archive);
      cmAlphaNum::cmAlphaNum(&local_230,(string *)((long)&source_date_epoch.field_2 + 8));
      cmStrCat<>(&local_1d0,&local_200,&local_230);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)(source_date_epoch.field_2._M_local_buf + 8));
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    std::__cxx11::string::string((string *)local_270);
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_270);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) &&
       (iVar1 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar1 != 0)) {
      cmAlphaNum::cmAlphaNum(&local_2c0,"archive_write_set_filter_option: ");
      cm_archive_error_string_abi_cxx11_(&local_310,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_2f0,&local_310);
      cmStrCat<>(&local_290,&local_2c0,&local_2f0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_310);
      local_10c = 1;
    }
    else {
      local_10c = 0;
    }
    std::__cxx11::string::~string((string *)local_270);
    if (local_10c != 0) goto LAB_0012ee9c;
    break;
  case CompressBZip2:
    iVar1 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_360,"archive_write_add_filter_bzip2: ");
      cm_archive_error_string_abi_cxx11_(&local_3b0,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_390,&local_3b0);
      cmStrCat<>(&local_330,&local_360,&local_390);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_3b0);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    break;
  case CompressLZMA:
    iVar1 = archive_write_add_filter_lzma(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_400,"archive_write_add_filter_lzma: ");
      cm_archive_error_string_abi_cxx11_(&local_450,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_430,&local_450);
      cmStrCat<>(&local_3d0,&local_400,&local_430);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_450);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    break;
  case CompressXZ:
    iVar1 = archive_write_add_filter_xz(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_4a0,"archive_write_add_filter_xz: ");
      cm_archive_error_string_abi_cxx11_(&local_4f0,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_4d0,&local_4f0);
      cmStrCat<>(&local_470,&local_4a0,&local_4d0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_4f0);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_filter_option(paVar2,"xz","threads",pcVar5);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_540,"archive_compressor_xz_options: ");
      cm_archive_error_string_abi_cxx11_(&local_590,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_570,&local_590);
      cmStrCat<>(&local_510,&local_540,&local_570);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_590);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    break;
  case CompressZstd:
    iVar1 = archive_write_add_filter_zstd(this->Archive);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_5e0,"archive_write_add_filter_zstd: ");
      cm_archive_error_string_abi_cxx11_(&local_630,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_610,&local_630);
      cmStrCat<>(&local_5b0,&local_5e0,&local_610);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_630);
      local_10c = 1;
      goto LAB_0012ee9c;
    }
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_filter_option(paVar2,"zstd","threads",pcVar5);
    if (iVar1 != 0) {
      cmAlphaNum::cmAlphaNum(&local_680,"archive_compressor_zstd_options: ");
      cm_archive_error_string_abi_cxx11_
                ((string *)((long)&compressionLevelStr.field_2 + 8),this->Archive);
      cmAlphaNum::cmAlphaNum(&local_6b0,(string *)((long)&compressionLevelStr.field_2 + 8));
      cmStrCat<>(&local_650,&local_680,&local_6b0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)(compressionLevelStr.field_2._M_local_buf + 8));
      local_10c = 1;
      goto LAB_0012ee9c;
    }
  }
  if (local_2c != 0) {
    std::__cxx11::to_string((string *)((long)&archiveFilterName.field_2 + 8),local_2c);
    std::__cxx11::string::string(local_710);
    switch(format_local._4_4_) {
    case CompressNone:
    case CompressCompress:
      break;
    case CompressGZip:
      std::__cxx11::string::operator=(local_710,"gzip");
      break;
    case CompressBZip2:
      std::__cxx11::string::operator=(local_710,"bzip2");
      break;
    case CompressLZMA:
      std::__cxx11::string::operator=(local_710,"lzma");
      break;
    case CompressXZ:
      std::__cxx11::string::operator=(local_710,"xz");
      break;
    case CompressZstd:
      std::__cxx11::string::operator=(local_710,"zstd");
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      paVar2 = this->Archive;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      v = (char *)std::__cxx11::string::c_str();
      iVar1 = archive_write_set_filter_option(paVar2,pcVar5,"compression-level",v);
      if (iVar1 == 0) goto LAB_0012eb85;
      cmAlphaNum::cmAlphaNum(&local_760,"archive_write_set_filter_option: ");
      cm_archive_error_string_abi_cxx11_(&local_7b0,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_790,&local_7b0);
      cmStrCat<>(&local_730,&local_760,&local_790);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_7b0);
      local_10c = 1;
    }
    else {
LAB_0012eb85:
      local_10c = 0;
    }
    std::__cxx11::string::~string(local_710);
    std::__cxx11::string::~string((string *)(archiveFilterName.field_2._M_local_buf + 8));
    if (local_10c != 0) goto LAB_0012ee9c;
  }
  iVar1 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar1 == 0) {
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_format_by_name(paVar2,pcVar5);
    if (iVar1 == 0) {
      iVar1 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar1 == 0) {
        local_10c = 0;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_940,"archive_write_set_bytes_in_last_block: ");
        cm_archive_error_string_abi_cxx11_(&local_990,this->Archive);
        cmAlphaNum::cmAlphaNum(&local_970,&local_990);
        cmStrCat<>(&local_910,&local_940,&local_970);
        std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_910);
        std::__cxx11::string::~string((string *)&local_910);
        std::__cxx11::string::~string((string *)&local_990);
        local_10c = 1;
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_8a0,"archive_write_set_format_by_name: ");
      cm_archive_error_string_abi_cxx11_(&local_8f0,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_8d0,&local_8f0);
      cmStrCat<>(&local_870,&local_8a0,&local_8d0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_870);
      std::__cxx11::string::~string((string *)&local_870);
      std::__cxx11::string::~string((string *)&local_8f0);
      local_10c = 1;
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_800,"archive_read_disk_set_standard_lookup: ");
    cm_archive_error_string_abi_cxx11_(&local_850,this->Archive);
    cmAlphaNum::cmAlphaNum(&local_830,&local_850);
    cmStrCat<>(&local_7d0,&local_800,&local_830);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_850);
    local_10c = 1;
  }
LAB_0012ee9c:
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format, int compressionLevel,
                               int numThreads)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Format(format)
{
  // Upstream fixed an issue with their integer parsing in 3.4.0
  // which would cause spurious errors to be raised from `strtoull`.

  if (numThreads < 1) {
    int upperLimit = (numThreads == 0) ? std::numeric_limits<int>::max()
                                       : std::abs(numThreads);

    numThreads =
      cm::clamp<int>(std::thread::hardware_concurrency(), 1, upperLimit);
  }

  std::string sNumThreads = std::to_string(numThreads);

  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_none: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_compress: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_gzip: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = cmStrCat("archive_write_set_filter_option: ",
                                 cm_archive_error_string(this->Archive));
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_bzip2: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_lzma: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_xz: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3004000

#  ifdef _AIX
      // FIXME: Using more than 2 threads creates an empty archive.
      // Enforce this limit pending further investigation.
      if (numThreads > 2) {
        numThreads = 2;
        sNumThreads = std::to_string(numThreads);
      }
#  endif
      if (archive_write_set_filter_option(this->Archive, "xz", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_xz_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif

      break;
    case CompressZstd:
      if (archive_write_add_filter_zstd(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_zstd: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3006000
      if (archive_write_set_filter_option(this->Archive, "zstd", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_zstd_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif
      break;
  }

  if (compressionLevel != 0) {
    std::string compressionLevelStr = std::to_string(compressionLevel);
    std::string archiveFilterName;
    switch (c) {
      case CompressNone:
      case CompressCompress:
        break;
      case CompressGZip:
        archiveFilterName = "gzip";
        break;
      case CompressBZip2:
        archiveFilterName = "bzip2";
        break;
      case CompressLZMA:
        archiveFilterName = "lzma";
        break;
      case CompressXZ:
        archiveFilterName = "xz";
        break;
      case CompressZstd:
        archiveFilterName = "zstd";
        break;
    }
    if (!archiveFilterName.empty()) {
      if (archive_write_set_filter_option(
            this->Archive, archiveFilterName.c_str(), "compression-level",
            compressionLevelStr.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_set_filter_option: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
    }
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_read_disk_set_standard_lookup: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_set_format_by_name: ",
                           cm_archive_error_string(this->Archive));
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = cmStrCat("archive_write_set_bytes_in_last_block: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
}